

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O2

void __thiscall
propset_token_source::insert_token(propset_token_source *this,tc_toktyp_t typ,char *txt,size_t len)

{
  CTcToken tok;
  CTcToken local_28;
  
  local_28.typ_ = typ;
  local_28.text_ = txt;
  local_28.text_len_ = len;
  insert_token(this,&local_28);
  return;
}

Assistant:

void propset_token_source::insert_token(
    tc_toktyp_t typ, const char *txt, size_t len)
{
    /* set up the token object */
    CTcToken tok;
    tok.settyp(typ);
    tok.set_text(txt, len);

    /* insert it */
    insert_token(&tok);
}